

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JXS.cpp
# Opt level: O2

void __thiscall
AS_02::JXS::MXFReader::MXFReader(MXFReader *this,IFileReaderFactory *fileReaderFactory)

{
  h__Reader *phVar1;
  h__Reader *this_00;
  Dictionary *d;
  
  this->_vptr_MXFReader = (_func_int **)&PTR__MXFReader_001693e0;
  (this->m_Reader).m_p = (h__Reader *)0x0;
  this_00 = (h__Reader *)operator_new(0x500);
  d = (Dictionary *)ASDCP::DefaultSMPTEDict();
  h__Reader::h__Reader(this_00,d,fileReaderFactory);
  phVar1 = (this->m_Reader).m_p;
  if (phVar1 != (h__Reader *)0x0) {
    (*(phVar1->super_h__AS02Reader).
      super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
      _vptr_TrackFileReader[1])();
  }
  (this->m_Reader).m_p = this_00;
  return;
}

Assistant:

AS_02::JXS::MXFReader::MXFReader(const Kumu::IFileReaderFactory& fileReaderFactory)
{
  m_Reader = new h__Reader(&DefaultSMPTEDict(), fileReaderFactory);
}